

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winingstate_test.cpp
# Opt level: O1

void __thiscall
TEST_WiningStateTest_ReadyHand_Test::testBody(TEST_WiningStateTest_ReadyHand_Test *this)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  UtestShell *pUVar3;
  _Rb_tree_header *p_Var4;
  char *pcVar5;
  char *pcVar6;
  _Base_ptr p_Var7;
  _Rb_tree_header *p_Var8;
  _Base_ptr p_Var9;
  SimpleString local_b8;
  SimpleString local_b0;
  TestTerminatorWithoutExceptions local_a8;
  DoublingFactorReport r;
  
  TEST_GROUP_CppUTestGroupWiningStateTest::addNoWiningHand
            (&this->super_TEST_GROUP_CppUTestGroupWiningStateTest,false);
  mahjong::PlayerHand::readyHand(&(this->super_TEST_GROUP_CppUTestGroupWiningStateTest).h);
  mahjong::WiningState::winByDiscard
            (&(this->super_TEST_GROUP_CppUTestGroupWiningStateTest).s,(WinByDiscardSituation)0x0);
  mahjong::DoubligFactorCounter::report(&r,&(this->super_TEST_GROUP_CppUTestGroupWiningStateTest).c)
  ;
  p_Var1 = &r.patterns._M_t._M_impl.super__Rb_tree_header;
  p_Var7 = &p_Var1->_M_header;
  for (p_Var9 = r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      (_Rb_tree_header *)p_Var9 != (_Rb_tree_header *)0x0;
      p_Var9 = (&p_Var9->_M_left)[(int)*(size_t *)(p_Var9 + 1) < 1]) {
    if (0 < (int)*(size_t *)(p_Var9 + 1)) {
      p_Var7 = p_Var9;
    }
  }
  p_Var8 = p_Var1;
  if (((_Rb_tree_header *)p_Var7 != p_Var1) &&
     (p_Var8 = (_Rb_tree_header *)p_Var7, 1 < (int)((_Rb_tree_header *)p_Var7)->_M_node_count)) {
    p_Var8 = p_Var1;
  }
  p_Var9 = &p_Var1->_M_header;
  p_Var7 = r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var8 == p_Var1) {
    for (; (_Rb_tree_header *)p_Var7 != (_Rb_tree_header *)0x0;
        p_Var7 = (&p_Var7->_M_left)[(int)*(size_t *)(p_Var7 + 1) < 1]) {
      if (0 < (int)*(size_t *)(p_Var7 + 1)) {
        p_Var9 = p_Var7;
      }
    }
    p_Var7 = &p_Var1->_M_header;
    p_Var2 = r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var8 = p_Var1;
    if (((_Rb_tree_header *)p_Var9 != p_Var1) &&
       (p_Var8 = (_Rb_tree_header *)p_Var9, 1 < (int)((_Rb_tree_header *)p_Var9)->_M_node_count)) {
      p_Var8 = p_Var1;
    }
    for (; (_Rb_tree_header *)p_Var2 != (_Rb_tree_header *)0x0;
        p_Var2 = (&p_Var2->_M_left)[(int)*(size_t *)(p_Var2 + 1) < 1]) {
      if (0 < (int)*(size_t *)(p_Var2 + 1)) {
        p_Var7 = p_Var2;
      }
    }
    p_Var4 = p_Var1;
    if (((_Rb_tree_header *)p_Var7 != p_Var1) &&
       (p_Var4 = (_Rb_tree_header *)p_Var7, 1 < (int)((_Rb_tree_header *)p_Var7)->_M_node_count)) {
      p_Var4 = p_Var1;
    }
    if ((p_Var4 == p_Var1) == (p_Var8 != p_Var1)) {
      pUVar3 = UtestShell::getCurrent();
      (*pUVar3->_vptr_UtestShell[0x1b])
                (pUVar3,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/winingstate_test.cpp"
                 ,0x74);
    }
    pUVar3 = UtestShell::getCurrent();
    StringFrom((int)&local_b8);
    pcVar5 = SimpleString::asCharString(&local_b8);
    for (; r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0;
        r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (&(r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_left)
             [(int)r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent[1]._M_color < 1
             ]) {
    }
    StringFrom((unsigned_long)&local_b0);
    pcVar6 = SimpleString::asCharString(&local_b0);
    local_a8.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e08b8;
    (*pUVar3->_vptr_UtestShell[0x16])
              (pUVar3,1,pcVar5,pcVar6,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/winingstate_test.cpp"
               ,0x74,&local_a8);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_a8);
    SimpleString::~SimpleString(&local_b0);
    SimpleString::~SimpleString(&local_b8);
  }
  else {
    pUVar3 = UtestShell::getCurrent();
    local_b8.buffer_ = (char *)&PTR_exitCurrentTest_001e08b8;
    (*pUVar3->_vptr_UtestShell[0xe])
              (pUVar3,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/winingstate_test.cpp"
               ,0x74,&local_b8);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_b8);
  }
  if (r.doubling_factor == 1) {
    pUVar3 = UtestShell::getCurrent();
    local_b8.buffer_ = (char *)&PTR_exitCurrentTest_001e08b8;
    (*pUVar3->_vptr_UtestShell[0xe])
              (pUVar3,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/winingstate_test.cpp"
               ,0x75,&local_b8);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_b8);
  }
  else {
    pUVar3 = UtestShell::getCurrent();
    StringFrom((int)&local_b8);
    pcVar5 = SimpleString::asCharString(&local_b8);
    StringFrom((int)&local_b0);
    pcVar6 = SimpleString::asCharString(&local_b0);
    local_a8.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e08b8;
    (*pUVar3->_vptr_UtestShell[0x16])
              (pUVar3,1,pcVar5,pcVar6,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/winingstate_test.cpp"
               ,0x75,&local_a8);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_a8);
    SimpleString::~SimpleString(&local_b0);
    SimpleString::~SimpleString(&local_b8);
  }
  std::
  _Rb_tree<mahjong::Pattern,_mahjong::Pattern,_std::_Identity<mahjong::Pattern>,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
  ::~_Rb_tree(&r.patterns._M_t);
  if (r.wining_hand.tiles.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(r.wining_hand.tiles.
                    super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)r.wining_hand.tiles.
                          super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)r.wining_hand.tiles.
                          super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<mahjong::Meld,_std::allocator<mahjong::Meld>_>::~vector(&r.wining_hand.melds);
  std::vector<mahjong::Pair,_std::allocator<mahjong::Pair>_>::~vector
            ((vector<mahjong::Pair,_std::allocator<mahjong::Pair>_> *)&r);
  return;
}

Assistant:

TEST(WiningStateTest, ReadyHand)
{
	addNoWiningHand();

	h.readyHand();	
	winByDiscard();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::ReadyHand));
	CHECK_EQUAL(1, r.doubling_factor);
}